

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O1

osfildef * os_create_tempfile(char *fname,char *buf)

{
  FILE *pFVar1;
  
  if ((fname != (char *)0x0) && (*fname != '\0')) {
    pFVar1 = fopen(fname,"w+b");
    return (osfildef *)pFVar1;
  }
  *buf = '\0';
  pFVar1 = tmpfile();
  return (osfildef *)pFVar1;
}

Assistant:

osfildef*
os_create_tempfile( const char* fname, char* buf )
{
    if (fname != 0 and fname[0] != '\0') {
        // A filename has been specified; use it.
        return fopen(fname, "w+b");
    }

    //ASSERT(buf != 0);

    // No filename needed; create a nameless tempfile.
    buf[0] = '\0';
    return tmpfile();
}